

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ircbot.cpp
# Opt level: O0

bool isloggedin(bool echo)

{
  int iVar1;
  IrcMsg *pIVar2;
  undefined4 extraout_var;
  int __type;
  char *local_18;
  byte local_a;
  bool local_9;
  bool echo_local;
  
  local_a = echo;
  pIVar2 = ircBot::lastmsg(&irc);
  local_18 = pIVar2->host;
  iVar1 = hashtable<char_*,_int>::access(&irc.IRCusers,(char *)&local_18,__type);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    if ((local_a & 1) != 0) {
      pIVar2 = ircBot::lastmsg(&irc);
      ircBot::notice(&irc,pIVar2->nick,"Error: Insufficient Permission");
    }
    local_9 = false;
  }
  else {
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool isloggedin(bool echo)
{
    /*for(int i = 0; i < irc.IRCusers.size(); i++)
    {
            if(!strcmp(irc.IRCusers[i], irc.lastmsg()->host))
                return true;
    }*/
    if(irc.IRCusers.access(irc.lastmsg()->host))
        return true;
    if(echo)
        irc.notice(irc.lastmsg()->nick, "Error: Insufficient Permission");
    return false;
}